

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_ssse3.c
# Opt level: O0

void av1_inv_txfm_add_ssse3(tran_low_t *dqcoeff,uint8_t *dst,int stride,TxfmParam *txfm_param)

{
  undefined1 *in_RCX;
  undefined4 in_EDX;
  int32_t *in_RSI;
  TX_TYPE tx_type;
  TxfmParam *in_stack_00002000;
  int in_stack_0000200c;
  uint8_t *in_stack_00002010;
  tran_low_t *in_stack_00002018;
  undefined3 in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe8;
  
  if (*(int *)(in_RCX + 4) == 0) {
    av1_lowbd_inv_txfm2d_add_ssse3
              (in_RSI,(uint8_t *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),
               (int)((ulong)in_RCX >> 0x20),(TX_TYPE)((ulong)in_RCX >> 0x18),
               (TX_SIZE)((ulong)in_RCX >> 0x10),CONCAT13(*in_RCX,in_stack_ffffffffffffffdc));
  }
  else {
    av1_inv_txfm_add_c(in_stack_00002018,in_stack_00002010,in_stack_0000200c,in_stack_00002000);
  }
  return;
}

Assistant:

void av1_inv_txfm_add_ssse3(const tran_low_t *dqcoeff, uint8_t *dst, int stride,
                            const TxfmParam *txfm_param) {
  if (!txfm_param->lossless) {
    const TX_TYPE tx_type = txfm_param->tx_type;
    av1_lowbd_inv_txfm2d_add_ssse3(dqcoeff, dst, stride, tx_type,
                                   txfm_param->tx_size, txfm_param->eob);

  } else {
    av1_inv_txfm_add_c(dqcoeff, dst, stride, txfm_param);
  }
}